

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O2

bool __thiscall
boost::algorithm::detail::is_any_ofF<char>::operator()(is_any_ofF<char> *this,char Ch)

{
  size_t *psVar1;
  bool bVar2;
  char local_1;
  
  psVar1 = &this->m_Size;
  if (0x10 < *psVar1) {
    this = (is_any_ofF<char> *)(this->m_Storage).m_dynSet;
  }
  bVar2 = std::binary_search<char_const*,char>
                    ((char *)this,(this->m_Storage).m_fixSet + *psVar1,&local_1);
  return bVar2;
}

Assistant:

bool operator()( Char2T Ch ) const
                {
                    const set_value_type* Storage=
                        (use_fixed_storage(m_Size))
                        ? &m_Storage.m_fixSet[0]
                        : m_Storage.m_dynSet;

                    return ::std::binary_search(Storage, Storage+m_Size, Ch);
                }